

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_key_exchange(EC_GROUP *group,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                      ptls_iovec_t peerkey,BN_CTX *bn_ctx)

{
  int iVar1;
  EC_POINT *pub_key;
  EC_POINT *point;
  uint8_t *puVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_90;
  size_t local_88;
  int local_4c;
  EC_KEY *pEStack_48;
  int ret;
  EC_KEY *privkey;
  EC_POINT *peer_point;
  BN_CTX *bn_ctx_local;
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  EC_GROUP *group_local;
  ptls_iovec_t peerkey_local;
  
  pEStack_48 = (EC_KEY *)0x0;
  pubkey->base = (uint8_t *)0x0;
  pubkey->len = 0;
  secret->base = (uint8_t *)0x0;
  secret->len = 0;
  pub_key = x9_62_decode_point(group,peerkey,bn_ctx);
  if (pub_key == (EC_POINT *)0x0) {
    local_4c = 0x32;
  }
  else {
    pEStack_48 = ecdh_generate_key(group);
    if (pEStack_48 == (EC_KEY *)0x0) {
      local_4c = 0x201;
    }
    else {
      point = EC_KEY_get0_public_key((EC_KEY *)pEStack_48);
      pVar3 = x9_62_encode_point(group,(EC_POINT *)point,bn_ctx);
      local_90 = pVar3.base;
      pubkey->base = local_90;
      local_88 = pVar3.len;
      pubkey->len = local_88;
      if (pubkey->base == (uint8_t *)0x0) {
        local_4c = 0x201;
      }
      else {
        iVar1 = EC_GROUP_get_degree((EC_GROUP *)group);
        secret->len = (long)((iVar1 + 7) / 8);
        puVar2 = (uint8_t *)malloc(secret->len);
        secret->base = puVar2;
        if (puVar2 == (uint8_t *)0x0) {
          local_4c = 0x201;
        }
        else {
          iVar1 = ECDH_compute_key(secret->base,secret->len,(EC_POINT *)pub_key,(EC_KEY *)pEStack_48
                                   ,(KDF *)0x0);
          if (iVar1 < 1) {
            local_4c = 0x28;
          }
          else {
            local_4c = 0;
          }
        }
      }
    }
  }
  if (pub_key != (EC_POINT *)0x0) {
    EC_POINT_free((EC_POINT *)pub_key);
  }
  if (pEStack_48 != (EC_KEY *)0x0) {
    EC_KEY_free((EC_KEY *)pEStack_48);
  }
  if (local_4c != 0) {
    free(pubkey->base);
    pubkey->base = (uint8_t *)0x0;
    pubkey->len = 0;
    free(secret->base);
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
  }
  return local_4c;
}

Assistant:

static int x9_62_key_exchange(EC_GROUP *group, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey, BN_CTX *bn_ctx)
{
    EC_POINT *peer_point = NULL;
    EC_KEY *privkey = NULL;
    int ret;

    *pubkey = (ptls_iovec_t){NULL};
    *secret = (ptls_iovec_t){NULL};

    /* decode peer key */
    if ((peer_point = x9_62_decode_point(group, peerkey, bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    /* create private key */
    if ((privkey = ecdh_generate_key(group)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* encode public key */
    if ((*pubkey = x9_62_encode_point(group, EC_KEY_get0_public_key(privkey), bn_ctx)).base == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* allocate space for secret */
    secret->len = (EC_GROUP_get_degree(group) + 7) / 8;
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* calc secret */
    if (ECDH_compute_key(secret->base, secret->len, peer_point, privkey, NULL) <= 0) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE; /* ??? */
        goto Exit;
    }

    ret = 0;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    if (privkey != NULL)
        EC_KEY_free(privkey);
    if (ret != 0) {
        free(pubkey->base);
        *pubkey = (ptls_iovec_t){NULL};
        free(secret->base);
        *secret = (ptls_iovec_t){NULL};
    }
    return ret;
}